

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O2

int Smt_PrsBuildNode(Wlc_Ntk_t *pNtk,Smt_Prs_t *p,int iNode,int RangeOut,char *pName)

{
  undefined8 uVar1;
  char cVar2;
  Abc_Nam_t *p_00;
  int iVar3;
  int iVar4;
  int iVar5;
  int Id;
  Vec_Int_t *vFans;
  char *pcVar6;
  char *pcVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Vec_Int_t *pVVar8;
  Wlc_Obj_t *pWVar9;
  int i;
  uint local_5c;
  uint local_58;
  int local_54;
  char *local_50;
  undefined8 local_48;
  int local_3c [3];
  
  iVar4 = 1;
  local_50 = pName;
  do {
    iVar3 = Abc_LitIsCompl(iNode);
    if (iVar3 != 0) {
      p_00 = p->pStrs;
      iVar4 = Abc_Lit2Var(iNode);
      pcVar7 = Abc_NamStr(p_00,iVar4);
      if (*pcVar7 != '#' && 9 < (byte)(*pcVar7 - 0x30U)) {
        iVar4 = Abc_NamStrFindOrAdd(pNtk->pManName,pcVar7,local_3c);
        if (local_3c[0] != 0) {
          return iVar4;
        }
        __assert_fail("fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                      ,0x15c,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
      }
LAB_002babf9:
      iVar4 = Smt_PrsBuildConstant(pNtk,pcVar7,RangeOut,local_50);
      return iVar4;
    }
    vFans = Smt_EntryNode(p,iNode);
    pcVar6 = Smt_VecEntryName(p,vFans,0);
    pcVar7 = Smt_VecEntryName(p,vFans,1);
    if (pcVar7 == (char *)0x0 || pcVar6 == (char *)0x0) {
      if (pcVar6 != (char *)0x0) {
        cVar2 = *pcVar6;
        goto LAB_002bab5c;
      }
LAB_002bacf2:
      iVar3 = Vec_IntEntry(vFans,0);
      iVar5 = Abc_LitIsCompl(iVar3);
      if (iVar5 == 0) {
        pVVar8 = Smt_EntryNode(p,iVar3);
        pcVar6 = Smt_VecEntryName(p,pVVar8,0);
        if (pVVar8->nSize < 3) {
          __assert_fail("Vec_IntSize(vFans) >= 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                        ,0xe9,"int Smt_PrsReadType(Smt_Prs_t *, int, int *, int *, int *)");
        }
        if ((*pcVar6 != '_') || (pcVar6[1] != '\0')) {
          __assert_fail("!strcmp(pStr, \"_\")",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                        ,0xea,"int Smt_PrsReadType(Smt_Prs_t *, int, int *, int *, int *)");
        }
        pcVar6 = Smt_VecEntryName(p,pVVar8,1);
        iVar3 = Smt_StrToType(pcVar6,&local_54);
        local_48 = CONCAT44(extraout_var_00,iVar3);
        pcVar6 = Smt_VecEntryName(p,pVVar8,2);
        local_5c = atoi(pcVar6);
        if (pVVar8->nSize < 4) {
          local_58 = 0xffffffff;
        }
        else {
          pcVar6 = Smt_VecEntryName(p,pVVar8,3);
          local_58 = atoi(pcVar6);
        }
      }
      else {
        pcVar6 = Smt_EntryName(p,iVar3);
        iVar3 = Smt_StrToType(pcVar6,&local_54);
        local_48 = CONCAT44(extraout_var,iVar3);
        local_5c = 0xffffffff;
        local_58 = local_5c;
      }
      pVVar8 = Vec_IntAlloc(100);
      for (; iVar4 < vFans->nSize; iVar4 = iVar4 + 1) {
        iVar3 = Vec_IntEntry(vFans,iVar4);
        iVar3 = Smt_PrsBuildNode(pNtk,p,iVar3,-1,(char *)0x0);
        if (iVar3 == 0) {
          Vec_IntFree(pVVar8);
          return 0;
        }
        Vec_IntPush(pVVar8,iVar3);
      }
      iVar4 = (int)local_48;
      if (0xfffffffd < iVar4 - 0x17U) {
        __assert_fail("Type != WLC_OBJ_BIT_SIGNEXT && Type != WLC_OBJ_BIT_ZEROPAD",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                      ,0x198,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
      }
      if (iVar4 == 0x13) {
        if ((((int)local_5c < 0) || ((int)local_58 < 0)) ||
           (iVar3 = local_5c - local_58, (int)local_5c < (int)local_58)) {
          __assert_fail("Value1 >= 0 && Value2 >= 0 && Value1 >= Value2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                        ,0x19b,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
        }
        Vec_IntPush(pVVar8,local_5c << 0x10 | local_58);
LAB_002baf48:
        iVar3 = iVar3 + 1;
      }
      else {
        if (iVar4 - 0xdU < 2) {
          if ((int)local_5c < 0) {
            __assert_fail("Value1 >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                          ,0x1a1,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)")
            ;
          }
          sprintf((char *)local_3c,"%d");
          iVar3 = Smt_PrsBuildConstant(pNtk,(char *)local_3c,-1,(char *)0x0);
          Vec_IntPush(pVVar8,iVar3);
        }
        if (iVar4 - 0x17U < 0xd) {
          iVar3 = 1;
          pcVar6 = local_50;
          goto LAB_002baf66;
        }
        if (iVar4 == 8) {
          if (pVVar8->nSize != 3) {
            __assert_fail("Vec_IntSize(vFanins) == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                          ,0x1b4,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)")
            ;
          }
          uVar1 = *(undefined8 *)(pVVar8->pArray + 1);
          *(ulong *)(pVVar8->pArray + 1) = CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
          iVar3 = 1;
LAB_002baf33:
          iVar3 = Vec_IntEntry(pVVar8,iVar3);
          pWVar9 = Wlc_NtkObj(pNtk,iVar3);
          iVar3 = pWVar9->End - pWVar9->Beg;
          goto LAB_002baf48;
        }
        if (iVar4 != 0x14) {
          iVar3 = 0;
          goto LAB_002baf33;
        }
        iVar5 = pVVar8->nSize;
        iVar3 = 0;
        for (i = 0; i < iVar5; i = i + 1) {
          Id = Vec_IntEntry(pVVar8,i);
          pWVar9 = Wlc_NtkObj(pNtk,Id);
          iVar3 = ((iVar3 + pWVar9->End) - pWVar9->Beg) + 1;
        }
      }
      pcVar6 = local_50;
      if (iVar3 < 1) {
        __assert_fail("Range > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                      ,0x1bf,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
      }
LAB_002baf66:
      iVar4 = Smt_PrsCreateNode(pNtk,iVar4,local_54,iVar3,pVVar8,pcVar6);
      Vec_IntFree(pVVar8);
      return iVar4;
    }
    cVar2 = *pcVar6;
    if (cVar2 == '_') {
      if ((*pcVar7 != 'b') || (pcVar7[1] != 'v')) goto LAB_002bacf2;
      pcVar6 = Smt_VecEntryName(p,vFans,2);
      if (vFans->nSize != 3) {
        __assert_fail("Vec_IntSize(vFans) == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                      ,0x169,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
      }
      pcVar7 = pcVar6 + 2;
      RangeOut = atoi(pcVar6);
      goto LAB_002babf9;
    }
LAB_002bab5c:
    if (cVar2 != '=') goto LAB_002bacf2;
    if (vFans->nSize != 3) {
      __assert_fail("Vec_IntSize(vFans) == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                    ,0x16e,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
    }
    iVar3 = Vec_IntEntry(vFans,2);
    iVar5 = Abc_LitIsCompl(iVar3);
    if (iVar5 == 0) {
      __assert_fail("Smt_EntryIsName(iNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                    ,0x170,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
    }
    pcVar6 = Smt_EntryName(p,iVar3);
    iVar3 = strcmp("#b1",pcVar6);
    if (iVar3 != 0) {
      pVVar8 = Vec_IntAlloc(2);
      iVar4 = Smt_PrsBuildConstant(pNtk,pcVar6,-1,(char *)0x0);
      iVar3 = 1;
      iVar5 = Vec_IntEntry(vFans,1);
      pcVar6 = local_50;
      iVar5 = Smt_PrsBuildNode(pNtk,p,iVar5,-1,local_50);
      Vec_IntPush(pVVar8,iVar5);
      Vec_IntPush(pVVar8,iVar4);
      iVar4 = 0x1b;
      local_54 = 0;
      goto LAB_002baf66;
    }
    iNode = Vec_IntEntry(vFans,1);
    RangeOut = -1;
  } while( true );
}

Assistant:

int Smt_PrsBuildNode( Wlc_Ntk_t * pNtk, Smt_Prs_t * p, int iNode, int RangeOut, char * pName )
{
    if ( Smt_EntryIsName(iNode) ) // name or constant
    {
        char * pStr = Abc_NamStr(p->pStrs, Abc_Lit2Var(iNode));
        if ( (pStr[0] >= '0' && pStr[0] <= '9') || pStr[0] == '#' )
        { 
            // (_ BitVec 8) #x19
            return Smt_PrsBuildConstant( pNtk, pStr, RangeOut, pName );
        }
        else
        {
            // s3087
            int fFound, iObj = Abc_NamStrFindOrAdd( pNtk->pManName, pStr, &fFound );
            assert( fFound );
            return iObj;
        }
    }
    else // node
    {
        Vec_Int_t * vFans = Smt_EntryNode( p, iNode );
        char * pStr0 = Smt_VecEntryName( p, vFans, 0 );
        char * pStr1 = Smt_VecEntryName( p, vFans, 1 );
        if ( pStr0 && pStr1 && pStr0[0] == '_' && pStr1[0] == 'b' && pStr1[1] == 'v' )
        {
            // (_ bv1 32)
            char * pStr2 = Smt_VecEntryName( p, vFans, 2 );
            assert( Vec_IntSize(vFans) == 3 );
            return Smt_PrsBuildConstant( pNtk, pStr2+2, atoi(pStr2), pName );
        }
        else if ( pStr0 && pStr0[0] == '=' )
        {
            assert( Vec_IntSize(vFans) == 3 );
            iNode = Vec_IntEntry(vFans, 2);
            assert( Smt_EntryIsName(iNode) );
            pStr0 = Smt_EntryName(p, iNode);
            // check the last one is "#b1"
            if ( !strcmp("#b1", pStr0) )
            {
                iNode = Vec_IntEntry(vFans, 1);
                return Smt_PrsBuildNode( pNtk, p, iNode, -1, pName );
            }
            else
            {
                Vec_Int_t * vFanins = Vec_IntAlloc( 2 );
                // get the constant
                int iObj, iOper, iConst = Smt_PrsBuildConstant( pNtk, pStr0, -1, NULL );
                // check the middle one is an operator
                iNode = Vec_IntEntry(vFans, 1);
                iOper = Smt_PrsBuildNode( pNtk, p, iNode, -1, pName );
                // build comparator
                Vec_IntPushTwo( vFanins, iOper, iConst );
                iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_COMP_EQU, 0, 1, vFanins, pName );
                Vec_IntFree( vFanins );
                return iObj;
            }
        }
        else
        {
            int i, Fan, NameId, iFanin, fSigned, Range, Value1 = -1, Value2 = -1;
            int Type = Smt_PrsReadType( p, Vec_IntEntry(vFans, 0), &fSigned, &Value1, &Value2 );
            // collect fanins
            Vec_Int_t * vFanins = Vec_IntAlloc( 100 );
            Vec_IntForEachEntryStart( vFans, Fan, i, 1 )
            {
                iFanin = Smt_PrsBuildNode( pNtk, p, Fan, -1, NULL );
                if ( iFanin == 0 )
                {
                    Vec_IntFree( vFanins );
                    return 0;
                }
                Vec_IntPush( vFanins, iFanin );
            }
            // update specialized nodes
            assert( Type != WLC_OBJ_BIT_SIGNEXT && Type != WLC_OBJ_BIT_ZEROPAD );
            if ( Type == WLC_OBJ_BIT_SELECT )
            {
                assert( Value1 >= 0 && Value2 >= 0 && Value1 >= Value2 );
                Vec_IntPush( vFanins, (Value1 << 16) | Value2 );
            }
            else if ( Type == WLC_OBJ_ROTATE_R || Type == WLC_OBJ_ROTATE_L )
            {
                char Buffer[10];
                assert( Value1 >= 0 );
                sprintf( Buffer, "%d", Value1 ); 
                NameId = Smt_PrsBuildConstant( pNtk, Buffer, -1, NULL );
                Vec_IntPush( vFanins, NameId );
            }
            // find range
            Range = 0;
            if ( Type >= WLC_OBJ_LOGIC_NOT && Type <= WLC_OBJ_REDUCT_XOR )
                Range = 1;
            else if ( Type == WLC_OBJ_BIT_SELECT )
                Range = Value1 - Value2 + 1;
            else if ( Type == WLC_OBJ_BIT_CONCAT )
            {
                Vec_IntForEachEntry( vFanins, NameId, i )
                    Range += Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            else if ( Type == WLC_OBJ_MUX )
            {
                int * pArray = Vec_IntArray(vFanins);
                assert( Vec_IntSize(vFanins) == 3 );
                ABC_SWAP( int, pArray[1], pArray[2] );
                NameId = Vec_IntEntry(vFanins, 1);
                Range = Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            else // to determine range, look at the first argument
            {
                NameId = Vec_IntEntry(vFanins, 0);
                Range = Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            // create node
            assert( Range > 0 );
            NameId = Smt_PrsCreateNode( pNtk, Type, fSigned, Range, vFanins, pName );
            Vec_IntFree( vFanins );
            return NameId;
        }
    }
}